

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O3

int Abc_SclTimeIncUpdate(SC_Man *p)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  long *plVar7;
  Abc_Obj_t *pAVar8;
  SC_Pair *pSVar9;
  SC_Pair *pSVar10;
  void *pvVar11;
  Abc_Obj_t *pNode;
  Vec_Int_t *pVVar12;
  bool bVar13;
  int iVar14;
  uint uVar15;
  Vec_Int_t *pVVar16;
  ulong uVar17;
  uint uVar18;
  Vec_Wec_t *pVVar19;
  Vec_Que_t *pVVar20;
  char *__function;
  Abc_Ntk_t *pAVar21;
  SC_Timing *pTime;
  char *__file;
  long lVar22;
  long lVar23;
  long lVar24;
  float fVar25;
  float fVar26;
  
  pVVar16 = p->vChanged;
  if (pVVar16->nSize == 0) {
    return 0;
  }
  if (0 < pVVar16->nSize) {
    lVar23 = 0;
    do {
      iVar14 = pVVar16->pArray[lVar23];
      if (((long)iVar14 < 0) || (pVVar6 = p->pNtk->vObjs, pVVar6->nSize <= iVar14))
      goto LAB_003f72a0;
      plVar7 = (long *)pVVar6->pArray[iVar14];
      if (plVar7 != (long *)0x0) {
        iVar14 = *(int *)((long)plVar7 + 0x1c);
        if (0 < iVar14) {
          lVar22 = 0;
          do {
            lVar24 = *(long *)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                              (long)*(int *)(plVar7[4] + lVar22 * 4) * 8);
            uVar15 = *(uint *)(lVar24 + 0x14);
            if ((uVar15 & 0xf) != 8 && (char)((uVar15 & 0x40) >> 6) == '\0') {
              *(uint *)(lVar24 + 0x14) = uVar15 | 0x40;
              if (p->vLevels->nSize <= (int)(uVar15 >> 0xc)) goto LAB_003f72bf;
              Vec_IntPush((Vec_Int_t *)
                          ((long)&p->vLevels->pArray->nCap + (ulong)((uVar15 >> 0xc) << 4)),
                          *(int *)(lVar24 + 0x10));
              p->nIncUpdates = p->nIncUpdates + 1;
              iVar14 = *(int *)((long)plVar7 + 0x1c);
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < iVar14);
        }
        uVar15 = *(uint *)((long)plVar7 + 0x14);
        if ((uVar15 & 0x40) == 0) {
          if ((uVar15 & 0xf) == 8) {
            __assert_fail("!Abc_ObjIsLatch(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclSize.c"
                          ,0x1c9,"void Abc_SclTimeIncAddNode(SC_Man *, Abc_Obj_t *)");
          }
          *(uint *)((long)plVar7 + 0x14) = uVar15 | 0x40;
          if (p->vLevels->nSize <= (int)(uVar15 >> 0xc)) goto LAB_003f72bf;
          Vec_IntPush((Vec_Int_t *)((long)&p->vLevels->pArray->nCap + (ulong)((uVar15 >> 0xc) << 4))
                      ,(int)plVar7[2]);
          p->nIncUpdates = p->nIncUpdates + 1;
        }
      }
      lVar23 = lVar23 + 1;
      pVVar16 = p->vChanged;
    } while (lVar23 < pVVar16->nSize);
  }
  pVVar16->nSize = 0;
  pVVar19 = p->vLevels;
  uVar15 = pVVar19->nSize;
  if (0 < (int)uVar15) {
    lVar23 = 0;
    do {
      pVVar16 = pVVar19->pArray;
      if (0 < pVVar16[lVar23].nSize) {
        lVar22 = 0;
        do {
          iVar14 = pVVar16[lVar23].pArray[lVar22];
          if (((long)iVar14 < 0) || (pVVar6 = p->pNtk->vObjs, pVVar6->nSize <= iVar14))
          goto LAB_003f72a0;
          pAVar8 = (Abc_Obj_t *)pVVar6->pArray[iVar14];
          if (pAVar8 != (Abc_Obj_t *)0x0) {
            uVar15 = pAVar8->Id;
            pSVar9 = p->pTimes;
            if ((*(uint *)&pAVar8->field_0x14 & 0xf) - 5 < 0xfffffffe) {
              pSVar10 = p->pSlews;
              fVar25 = pSVar9[uVar15].rise;
              fVar2 = pSVar9[uVar15].fall;
              pSVar9[uVar15].rise = 0.0;
              pSVar9[uVar15].fall = 0.0;
              fVar26 = pSVar10[uVar15].rise;
              fVar3 = pSVar10[uVar15].fall;
              pSVar10[uVar15].rise = 0.0;
              pSVar10[uVar15].fall = 0.0;
              Abc_SclTimeNode(p,pAVar8,0);
              if ((((((0.1 <= fVar25 - pSVar9[uVar15].rise) || (0.1 <= pSVar9[uVar15].rise - fVar25)
                     ) || (0.1 <= fVar2 - pSVar9[uVar15].fall)) ||
                   ((0.1 <= pSVar9[uVar15].fall - fVar2 || (0.1 <= fVar26 - pSVar10[uVar15].rise))))
                  || ((0.1 <= pSVar10[uVar15].rise - fVar26 ||
                      ((0.1 <= fVar3 - pSVar10[uVar15].fall || (0.1 <= pSVar10[uVar15].fall - fVar3)
                       ))))) && (iVar14 = (pAVar8->vFanouts).nSize, 0 < iVar14)) {
                lVar24 = 0;
                do {
                  pvVar11 = pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanouts).pArray[lVar24]];
                  uVar15 = *(uint *)((long)pvVar11 + 0x14);
                  if ((uVar15 & 0xf) != 8 && (char)((uVar15 & 0x40) >> 6) == '\0') {
                    *(uint *)((long)pvVar11 + 0x14) = uVar15 | 0x40;
                    if (p->vLevels->nSize <= (int)(uVar15 >> 0xc)) goto LAB_003f72bf;
                    Vec_IntPush((Vec_Int_t *)
                                ((long)&p->vLevels->pArray->nCap + (ulong)((uVar15 >> 0xc) << 4)),
                                *(int *)((long)pvVar11 + 0x10));
                    p->nIncUpdates = p->nIncUpdates + 1;
                    iVar14 = (pAVar8->vFanouts).nSize;
                  }
                  lVar24 = lVar24 + 1;
                } while (lVar24 < iVar14);
              }
            }
            else {
              pSVar9[uVar15] =
                   pSVar9[*(uint *)((long)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray] +
                                   0x10)];
              iVar14 = (pAVar8->field_5).iData;
              if (((long)iVar14 < 0) || (p->vTimesOut->nSize <= iVar14)) {
                __file = 
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                ;
                __function = "void Vec_FltWriteEntry(Vec_Flt_t *, int, float)";
                goto LAB_003f72b5;
              }
              fVar25 = p->pTimes[(uint)pAVar8->Id].rise;
              fVar2 = p->pTimes[(uint)pAVar8->Id].fall;
              if (fVar25 <= fVar2) {
                fVar25 = fVar2;
              }
              p->vTimesOut->pArray[iVar14] = fVar25;
              Vec_QueUpdate(p->vQue,(pAVar8->field_5).iData);
            }
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 < pVVar16[lVar23].nSize);
        pVVar19 = p->vLevels;
      }
      lVar23 = lVar23 + 1;
      uVar15 = pVVar19->nSize;
    } while (lVar23 < (int)uVar15);
  }
  pVVar20 = p->vQue;
  if (pVVar20->nSize < 1) {
LAB_003f73b2:
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0x88,"int Vec_QueSize(Vec_Que_t *)");
  }
  if (pVVar20->nSize != 1) {
    iVar14 = pVVar20->pHeap[1];
    if (-1 < (long)iVar14) {
      pAVar21 = p->pNtk;
      if (iVar14 < pAVar21->vCos->nSize) {
        uVar18 = *(uint *)((long)pAVar21->vCos->pArray[iVar14] + 0x10);
        fVar25 = p->pTimes[uVar18].rise;
        fVar2 = p->pTimes[uVar18].fall;
        if (fVar25 <= fVar2) {
          fVar25 = fVar2;
        }
        p->MaxDelay = fVar25;
        if (0 < (int)uVar15) {
          uVar17 = (ulong)uVar15;
          do {
            if ((long)p->vLevels->nSize < (long)uVar17) {
LAB_003f72bf:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                            ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            uVar1 = uVar17 - 1;
            pVVar16 = p->vLevels->pArray;
            if (0 < pVVar16[uVar1].nSize) {
              lVar23 = 0;
              do {
                iVar14 = pVVar16[uVar1].pArray[lVar23];
                if (((long)iVar14 < 0) || (pVVar6 = p->pNtk->vObjs, pVVar6->nSize <= iVar14))
                goto LAB_003f72a0;
                pAVar8 = (Abc_Obj_t *)pVVar6->pArray[iVar14];
                if (pAVar8 != (Abc_Obj_t *)0x0) {
                  pSVar9 = p->pDepts;
                  uVar15 = pAVar8->Id;
                  fVar25 = pSVar9[uVar15].rise;
                  fVar2 = pSVar9[uVar15].fall;
                  pSVar9[uVar15].rise = 0.0;
                  pSVar9[uVar15].fall = 0.0;
                  iVar14 = (pAVar8->vFanouts).nSize;
                  if (iVar14 < 1) {
                    fVar26 = 0.0;
                  }
                  else {
                    lVar22 = 0;
                    do {
                      pNode = (Abc_Obj_t *)
                              pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanouts).pArray[lVar22]];
                      uVar18 = *(uint *)&pNode->field_0x14 & 0xf;
                      if ((8 < uVar18) || ((0x118U >> uVar18 & 1) == 0)) {
                        iVar14 = pNode->Id;
                        if ((long)iVar14 < 0) {
LAB_003f72fd:
                          __assert_fail("i >= 0 && i < p->nSize",
                                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                        }
                        pVVar12 = pNode->pNtk->vGates;
                        if (pVVar12->nSize <= iVar14) goto LAB_003f72fd;
                        uVar18 = pVVar12->pArray[iVar14];
                        if ((ulong)uVar18 == 0xffffffff) {
                          lVar24 = 0;
                        }
                        else {
                          if (((int)uVar18 < 0) ||
                             (pvVar11 = pNode->pNtk->pSCLib,
                             *(int *)((long)pvVar11 + 100) <= (int)uVar18)) goto LAB_003f72a0;
                          lVar24 = *(long *)(*(long *)((long)pvVar11 + 0x68) + (ulong)uVar18 * 8);
                        }
                        uVar18 = Abc_NodeFindFanin(pNode,pAVar8);
                        if ((int)uVar18 < 0) {
LAB_003f72de:
                          __assert_fail("iPin >= 0 && iPin < pCell->n_inputs",
                                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLib.h"
                                        ,0x28e,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
                        }
                        uVar4 = *(uint *)(lVar24 + 0x40);
                        if ((int)uVar4 <= (int)uVar18) goto LAB_003f72de;
                        if (*(int *)(lVar24 + 0x34) <= (int)uVar4) goto LAB_003f72a0;
                        lVar24 = *(long *)(*(long *)(lVar24 + 0x38) + (ulong)uVar4 * 8);
                        if (*(uint *)(lVar24 + 0x44) != uVar4) {
                          __assert_fail("Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs",
                                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLib.h"
                                        ,0x290,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
                        }
                        lVar24 = *(long *)(*(long *)(lVar24 + 0x48) + (ulong)uVar18 * 8);
                        iVar14 = *(int *)(lVar24 + 0xc);
                        if (iVar14 == 0) {
                          pTime = (SC_Timing *)0x0;
                        }
                        else {
                          if (iVar14 != 1) {
                            __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 1",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLib.h"
                                          ,0x294,"SC_Timing *Scl_CellPinTime(SC_Cell *, int)");
                          }
                          pTime = (SC_Timing *)**(undefined8 **)(lVar24 + 0x10);
                        }
                        Abc_SclDeptFanin(p,pTime,(Abc_Obj_t *)(ulong)(uint)pNode->Id,
                                         (Abc_Obj_t *)(ulong)(uint)pAVar8->Id);
                        iVar14 = (pAVar8->vFanouts).nSize;
                      }
                      lVar22 = lVar22 + 1;
                    } while (lVar22 < iVar14);
                    fVar26 = pSVar9[uVar15].rise;
                  }
                  if (((((0.1 <= fVar25 - fVar26) || (0.1 <= fVar26 - fVar25)) ||
                       (0.1 <= fVar2 - pSVar9[uVar15].fall)) || (0.1 <= pSVar9[uVar15].fall - fVar2)
                      ) && (iVar14 = (pAVar8->vFanins).nSize, 0 < iVar14)) {
                    lVar22 = 0;
                    do {
                      pvVar11 = pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[lVar22]];
                      uVar15 = *(uint *)((long)pvVar11 + 0x14);
                      if ((uVar15 & 0xf) != 8 && (char)((uVar15 & 0x40) >> 6) == '\0') {
                        *(uint *)((long)pvVar11 + 0x14) = uVar15 | 0x40;
                        if (p->vLevels->nSize <= (int)(uVar15 >> 0xc)) goto LAB_003f72bf;
                        Vec_IntPush((Vec_Int_t *)
                                    ((long)&p->vLevels->pArray->nCap + (ulong)((uVar15 >> 0xc) << 4)
                                    ),*(int *)((long)pvVar11 + 0x10));
                        p->nIncUpdates = p->nIncUpdates + 1;
                        iVar14 = (pAVar8->vFanins).nSize;
                      }
                      lVar22 = lVar22 + 1;
                    } while (lVar22 < iVar14);
                  }
                }
                lVar23 = lVar23 + 1;
              } while (lVar23 < pVVar16[uVar1].nSize);
            }
            bVar13 = 1 < (long)uVar17;
            uVar17 = uVar1;
          } while (bVar13);
          pVVar20 = p->vQue;
          if (pVVar20->nSize < 1) goto LAB_003f73b2;
          if (pVVar20->nSize == 1) goto LAB_003f72a0;
          pAVar21 = p->pNtk;
        }
        iVar14 = pVVar20->pHeap[1];
        if ((-1 < (long)iVar14) && (iVar14 < pAVar21->vCos->nSize)) {
          uVar15 = *(uint *)((long)pAVar21->vCos->pArray[iVar14] + 0x10);
          fVar25 = p->pTimes[uVar15].rise;
          fVar2 = p->pTimes[uVar15].fall;
          if (fVar25 <= fVar2) {
            fVar25 = fVar2;
          }
          pVVar19 = p->vLevels;
          p->MaxDelay = fVar25;
          if (0 < pVVar19->nSize) {
            lVar23 = 0;
            do {
              pVVar16 = pVVar19->pArray;
              iVar14 = pVVar16[lVar23].nSize;
              if (0 < iVar14) {
                lVar22 = 0;
                do {
                  iVar5 = pVVar16[lVar23].pArray[lVar22];
                  if (((long)iVar5 < 0) || (pVVar6 = p->pNtk->vObjs, pVVar6->nSize <= iVar5))
                  goto LAB_003f72a0;
                  pvVar11 = pVVar6->pArray[iVar5];
                  if (pvVar11 != (void *)0x0) {
                    if ((*(uint *)((long)pvVar11 + 0x14) & 0x40) == 0) {
                      __assert_fail("pObj->fMarkC == 1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclSize.c"
                                    ,0x1c1,"void Abc_SclTimeIncUpdateClean(SC_Man *)");
                    }
                    *(uint *)((long)pvVar11 + 0x14) = *(uint *)((long)pvVar11 + 0x14) & 0xffffffbf;
                    iVar14 = pVVar16[lVar23].nSize;
                  }
                  lVar22 = lVar22 + 1;
                } while (lVar22 < iVar14);
                pVVar19 = p->vLevels;
              }
              pVVar16[lVar23].nSize = 0;
              lVar23 = lVar23 + 1;
            } while (lVar23 < pVVar19->nSize);
          }
          iVar14 = p->nIncUpdates;
          p->nIncUpdates = 0;
          return iVar14;
        }
      }
    }
  }
LAB_003f72a0:
  __file = 
  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
  ;
  __function = "void *Vec_PtrEntry(Vec_Ptr_t *, int)";
LAB_003f72b5:
  __assert_fail("i >= 0 && i < p->nSize",__file,0x184,__function);
}

Assistant:

int Abc_SclTimeIncUpdate( SC_Man * p )
{
    Abc_Obj_t * pObj;
    int i, RetValue;
    if ( Vec_IntSize(p->vChanged) == 0 )
        return 0;
//    Abc_SclTimeIncCheckLevel( p->pNtk );
    Abc_NtkForEachObjVec( p->vChanged, p->pNtk, pObj, i )
    {
        Abc_SclTimeIncAddFanins( p, pObj );
        if ( pObj->fMarkC )
            continue;
        Abc_SclTimeIncAddNode( p, pObj );
    }
    Vec_IntClear( p->vChanged );
    Abc_SclTimeIncUpdateArrival( p );
    Abc_SclTimeIncUpdateDeparture( p );
    Abc_SclTimeIncUpdateClean( p );
    RetValue = p->nIncUpdates;
    p->nIncUpdates = 0;
    return RetValue;
}